

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

deUint32 __thiscall
sglr::ReferenceContext::createProgram(ReferenceContext *this,ShaderProgram *program)

{
  deUint32 dVar1;
  ShaderProgramObjectContainer *object;
  
  dVar1 = rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::allocateName(&this->m_programs)
  ;
  object = (ShaderProgramObjectContainer *)operator_new(0x20);
  (object->super_NamedObject).m_name = dVar1;
  (object->super_NamedObject).m_refCount = 1;
  (object->super_NamedObject)._vptr_NamedObject =
       (_func_int **)&PTR__ShaderProgramObjectContainer_00a30c30;
  object->m_program = program;
  object->m_deleteFlag = false;
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::insert(&this->m_programs,object);
  return dVar1;
}

Assistant:

deUint32 ReferenceContext::createProgram (ShaderProgram* program)
{
	int name = m_programs.allocateName();

	m_programs.insert(new rc::ShaderProgramObjectContainer(name, program));

	return name;
}